

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtCompoundCollisionAlgorithm.cpp
# Opt level: O2

cbtScalar __thiscall
cbtCompoundCollisionAlgorithm::calculateTimeOfImpact
          (cbtCompoundCollisionAlgorithm *this,cbtCollisionObject *body0,cbtCollisionObject *body1,
          cbtDispatcherInfo *dispatchInfo,cbtManifoldResult *resultOut)

{
  cbtTransform *pcVar1;
  cbtVector3 *pcVar2;
  cbtVector3 *pcVar3;
  cbtVector3 *pcVar4;
  uint uVar5;
  cbtCollisionShape *pcVar6;
  cbtCollisionAlgorithm *pcVar7;
  undefined1 auVar8 [16];
  ulong uVar9;
  long lVar10;
  cbtCollisionObject *pcVar11;
  cbtVector3 cVar12;
  undefined1 auVar13 [64];
  cbtTransform orgTrans;
  cbtTransform local_b8;
  cbtTransform local_70;
  
  auVar13 = ZEXT464(0x3f800000);
  pcVar11 = body1;
  if (this->m_isSwapped != false) {
    pcVar11 = body0;
    body0 = body1;
  }
  pcVar6 = body0->m_collisionShape;
  pcVar1 = &body0->m_worldTransform;
  pcVar2 = (body0->m_worldTransform).m_basis.m_el + 1;
  pcVar3 = (body0->m_worldTransform).m_basis.m_el + 2;
  pcVar4 = &(body0->m_worldTransform).m_origin;
  uVar5 = (this->m_childCollisionAlgorithms).m_size;
  lVar10 = 0;
  uVar9 = 0;
  while ((~((int)uVar5 >> 0x1f) & uVar5) != uVar9) {
    local_b8.m_basis.m_el[0].m_floats._0_8_ = *(undefined8 *)(pcVar1->m_basis).m_el[0].m_floats;
    local_b8.m_basis.m_el[0].m_floats._8_8_ =
         *(undefined8 *)((body0->m_worldTransform).m_basis.m_el[0].m_floats + 2);
    local_b8.m_basis.m_el[1].m_floats._0_8_ = *(undefined8 *)pcVar2->m_floats;
    local_b8.m_basis.m_el[1].m_floats._8_8_ =
         *(undefined8 *)((body0->m_worldTransform).m_basis.m_el[1].m_floats + 2);
    local_b8.m_basis.m_el[2].m_floats._0_8_ = *(undefined8 *)pcVar3->m_floats;
    local_b8.m_basis.m_el[2].m_floats._8_8_ =
         *(undefined8 *)((body0->m_worldTransform).m_basis.m_el[2].m_floats + 2);
    local_b8.m_origin.m_floats._0_8_ = *(undefined8 *)pcVar4->m_floats;
    local_b8.m_origin.m_floats._8_8_ =
         *(undefined8 *)((body0->m_worldTransform).m_origin.m_floats + 2);
    cbtTransform::operator*
              (&local_70,&local_b8,(cbtTransform *)((long)pcVar6[1].m_userPointer + lVar10));
    body0->m_updateRevision = body0->m_updateRevision + 1;
    *(undefined8 *)(pcVar1->m_basis).m_el[0].m_floats = local_70.m_basis.m_el[0].m_floats._0_8_;
    *(undefined8 *)((body0->m_worldTransform).m_basis.m_el[0].m_floats + 2) =
         local_70.m_basis.m_el[0].m_floats._8_8_;
    *(undefined8 *)pcVar2->m_floats = local_70.m_basis.m_el[1].m_floats._0_8_;
    *(undefined8 *)((body0->m_worldTransform).m_basis.m_el[1].m_floats + 2) =
         local_70.m_basis.m_el[1].m_floats._8_8_;
    *(undefined8 *)pcVar3->m_floats = local_70.m_basis.m_el[2].m_floats._0_8_;
    *(undefined8 *)((body0->m_worldTransform).m_basis.m_el[2].m_floats + 2) =
         local_70.m_basis.m_el[2].m_floats._8_8_;
    *&pcVar4->m_floats = local_70.m_origin.m_floats;
    pcVar7 = (this->m_childCollisionAlgorithms).m_data[uVar9];
    cVar12.m_floats = local_70.m_origin.m_floats;
    (*pcVar7->_vptr_cbtCollisionAlgorithm[3])(pcVar7,body0,pcVar11,dispatchInfo,resultOut);
    body0->m_updateRevision = body0->m_updateRevision + 1;
    uVar9 = uVar9 + 1;
    lVar10 = lVar10 + 0x58;
    auVar8 = vminss_avx((undefined1  [16])cVar12.m_floats,ZEXT416((uint)auVar13._0_4_));
    auVar13 = ZEXT1664(auVar8);
    *(undefined8 *)(pcVar1->m_basis).m_el[0].m_floats = local_b8.m_basis.m_el[0].m_floats._0_8_;
    *(undefined8 *)((body0->m_worldTransform).m_basis.m_el[0].m_floats + 2) =
         local_b8.m_basis.m_el[0].m_floats._8_8_;
    *(undefined8 *)pcVar2->m_floats = local_b8.m_basis.m_el[1].m_floats._0_8_;
    *(undefined8 *)((body0->m_worldTransform).m_basis.m_el[1].m_floats + 2) =
         local_b8.m_basis.m_el[1].m_floats._8_8_;
    *(undefined8 *)pcVar3->m_floats = local_b8.m_basis.m_el[2].m_floats._0_8_;
    *(undefined8 *)((body0->m_worldTransform).m_basis.m_el[2].m_floats + 2) =
         local_b8.m_basis.m_el[2].m_floats._8_8_;
    *(undefined8 *)pcVar4->m_floats = local_b8.m_origin.m_floats._0_8_;
    *(undefined8 *)((body0->m_worldTransform).m_origin.m_floats + 2) =
         local_b8.m_origin.m_floats._8_8_;
  }
  return auVar13._0_4_;
}

Assistant:

cbtScalar cbtCompoundCollisionAlgorithm::calculateTimeOfImpact(cbtCollisionObject* body0, cbtCollisionObject* body1, const cbtDispatcherInfo& dispatchInfo, cbtManifoldResult* resultOut)
{
	cbtAssert(0);
	//needs to be fixed, using cbtCollisionObjectWrapper and NOT modifying internal data structures
	cbtCollisionObject* colObj = m_isSwapped ? body1 : body0;
	cbtCollisionObject* otherObj = m_isSwapped ? body0 : body1;

	cbtAssert(colObj->getCollisionShape()->isCompound());

	cbtCompoundShape* compoundShape = static_cast<cbtCompoundShape*>(colObj->getCollisionShape());

	//We will use the OptimizedBVH, AABB tree to cull potential child-overlaps
	//If both proxies are Compound, we will deal with that directly, by performing sequential/parallel tree traversals
	//given Proxy0 and Proxy1, if both have a tree, Tree0 and Tree1, this means:
	//determine overlapping nodes of Proxy1 using Proxy0 AABB against Tree1
	//then use each overlapping node AABB against Tree0
	//and vise versa.

	cbtScalar hitFraction = cbtScalar(1.);

	int numChildren = m_childCollisionAlgorithms.size();
	int i;
	cbtTransform orgTrans;
	cbtScalar frac;
	for (i = 0; i < numChildren; i++)
	{
		//cbtCollisionShape* childShape = compoundShape->getChildShape(i);

		//backup
		orgTrans = colObj->getWorldTransform();

		const cbtTransform& childTrans = compoundShape->getChildTransform(i);
		//cbtTransform	newChildWorldTrans = orgTrans*childTrans ;
		colObj->setWorldTransform(orgTrans * childTrans);

		//cbtCollisionShape* tmpShape = colObj->getCollisionShape();
		//colObj->internalSetTemporaryCollisionShape( childShape );
		frac = m_childCollisionAlgorithms[i]->calculateTimeOfImpact(colObj, otherObj, dispatchInfo, resultOut);
		if (frac < hitFraction)
		{
			hitFraction = frac;
		}
		//revert back
		//colObj->internalSetTemporaryCollisionShape( tmpShape);
		colObj->setWorldTransform(orgTrans);
	}
	return hitFraction;
}